

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O3

void __thiscall
miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>
          (Node<unsigned_int> *this,KeyParser *ctx)

{
  long lVar1;
  long lVar2;
  undefined1 *puVar3;
  WshSatisfier *pWVar4;
  _Base_ptr p_Var5;
  Comp CVar6;
  pointer poVar7;
  pointer poVar8;
  _Base_ptr p_Var9;
  bool bVar10;
  bool bVar11;
  uchar auVar13 [4];
  byte bVar12;
  _Rb_tree_node_base *__tmp;
  _Rb_tree_header *p_Var14;
  WshSatisfier *pWVar15;
  _Rb_tree_node_base *p_Var16;
  _Rb_tree_node_base *p_Var17;
  long lVar18;
  ulong uVar19;
  pointer poVar20;
  pointer poVar21;
  uchar auVar22 [4];
  DummyState *in_RCX;
  WshSatisfier **ppWVar23;
  _Rb_tree_header *p_Var24;
  uchar auVar25 [4];
  _Rb_tree_header *p_Var26;
  _Rb_tree_node_base *p_Var27;
  undefined8 *puVar28;
  ulong uVar29;
  void *pvVar30;
  _Self __tmp_2;
  _Rb_tree_header *p_Var31;
  _Link_type __x;
  pointer poVar32;
  _Rb_tree_header *p_Var33;
  long lVar34;
  WshSatisfier *pWVar35;
  WshSatisfier *pWVar36;
  _Rb_tree_impl<Comp,_false> *__src_impl;
  long lVar37;
  ulong uVar38;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar39;
  vector<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  results;
  vector<StackElem,_std::allocator<StackElem>_> stack;
  vector<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  local_198;
  void *local_178;
  void *pvStack_170;
  long local_168;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
  local_158;
  _Base_ptr local_128;
  _Rb_tree_node_base local_120;
  undefined1 local_100 [32];
  _Base_ptr local_e0;
  _Base_ptr local_d8;
  _Base_ptr p_Stack_d0;
  undefined1 local_c8 [40];
  _Base_ptr local_a0;
  _Rb_tree_header *local_98;
  _Rb_tree_header *p_Stack_90;
  WshSatisfier *local_88;
  char local_80;
  byte local_78;
  Comp local_70;
  _Rb_tree_header local_68;
  byte local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_168 = 0;
  local_178 = (void *)0x0;
  pvStack_170 = (void *)0x0;
  local_198.
  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.
  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._24_8_ = local_c8._24_8_ & 0xffffffff00000000;
  std::
  vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1}>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lamb...espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1})const::StackElem>>
  ::
  emplace_back<miniscript::Node<unsigned_int>const&,int,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_)const::DummyState>
            ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lamb___espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>__1__const__StackElem>>
              *)&local_178,this,(int *)(local_c8 + 0x18),in_RCX);
  if (pvStack_170 == local_178) {
    p_Var24 = (_Rb_tree_header *)0x0;
    poVar21 = (pointer)0x0;
  }
  else {
    p_Var24 = (_Rb_tree_header *)0x0;
    pvVar30 = pvStack_170;
    do {
      p_Var33 = &local_158._M_impl.super__Rb_tree_header;
      lVar18 = *(long *)((long)pvVar30 + -0x18);
      p_Var31 = *(_Rb_tree_header **)((long)pvVar30 + -0x10);
      lVar1 = *(long *)(lVar18 + 0x38);
      lVar2 = *(long *)(lVar18 + 0x40);
      p_Var14 = (_Rb_tree_header *)(lVar2 - lVar1 >> 4);
      if (p_Var31 < p_Var14) {
        *(byte **)((long)pvVar30 + -0x10) = (byte *)((long)&(p_Var31->_M_header)._M_color + 1);
        local_c8._24_8_ = local_c8._24_8_ & 0xffffffff00000000;
        std::
        vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1}>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::{lamb...espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)#1})const::StackElem>>
        ::
        emplace_back<miniscript::Node<unsigned_int>const&,int,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_)const::DummyState>
                  ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::TreeEval<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::Comp,std::allocator<unsigned_int>>>,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lambda(miniscript::Node<unsigned_int>const&,Span<std::optional<std::set<unsigned_int,miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>)_1_>(miniscript::Node<unsigned_int>::DuplicateKeyCheck<(anonymous_namespace)::KeyParser>((anonymous_namespace)::KeyParser_const&)const::_lamb___espace)::KeyParser>(auto:1_const&)const::Comp,std::allocator<unsigned_int>>>>__1__const__StackElem>>
                    *)&local_178,
                   *(Node<unsigned_int> **)((DummyState *)((long)p_Var31 * 0x10) + lVar1),
                   (int *)(local_c8 + 0x18),(DummyState *)((long)p_Var31 * 0x10));
        pvVar30 = pvStack_170;
      }
      else {
        p_Var31 = (_Rb_tree_header *)
                  (((long)p_Var24 -
                    (long)local_198.
                          super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
        if (p_Var31 < p_Var14) {
          __assert_fail("results.size() >= node.subs.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                        ,0x273,
                        "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = std::optional<std::set<unsigned int, Comp>>, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
                       );
        }
        if ((*(char *)(lVar18 + 0xa1) == '\x01') && (*(char *)(lVar18 + 0xa0) != '\0')) {
LAB_0039c60e:
          local_80 = '\0';
        }
        else {
          lVar37 = (long)local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                   (long)p_Var14 * -0x38 +
                   ((long)p_Var24 -
                   (long)local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
          lVar34 = lVar37;
          if (lVar2 != lVar1) {
            do {
              if (*(char *)(lVar34 + 0x30) == '\0') {
                *(undefined2 *)(lVar18 + 0xa0) = 0x101;
                goto LAB_0039c60e;
              }
              lVar34 = lVar34 + 0x38;
            } while ((_Rb_tree_header *)lVar34 != p_Var24);
          }
          p_Var14 = *(_Rb_tree_header **)(lVar18 + 8);
          puVar3 = *(undefined1 **)(lVar18 + 0x10);
          local_158._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = '\0';
          local_158._M_impl.super__Rb_tree_header._M_header._M_color._1_1_ = '\0';
          local_158._M_impl.super__Rb_tree_header._M_header._M_color._2_1_ = '\0';
          local_158._M_impl.super__Rb_tree_header._M_header._M_color._3_1_ = '\0';
          local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
          lVar34 = (long)puVar3 - (long)p_Var14;
          local_158._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr =
               (Comp)(Comp)ctx;
          local_158._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var33->_M_header;
          local_158._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var33->_M_header;
          if (lVar34 != 0) {
            do {
              if ((WshSatisfier *)local_158._M_impl.super__Rb_tree_header._M_node_count ==
                  (WshSatisfier *)0x0) {
LAB_0039c299:
                p_Var31 = p_Var14;
                pVar39 = std::
                         _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                         ::_M_get_insert_unique_pos(&local_158,(key_type_conflict *)p_Var14);
                p_Var26 = (_Rb_tree_header *)pVar39.second;
                bVar10 = pVar39.first != (_Rb_tree_node_base *)0x0;
              }
              else {
                p_Var31 = *(_Rb_tree_header **)
                           ((long)local_158._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.
                                  ctx_ptr + 0x18);
                bVar10 = DuplicateKeyCheck<(anonymous_namespace)::KeyParser>::Comp::operator()
                                   ((Comp *)(((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                                               *)((long)local_158._M_impl.
                                                        super__Rb_tree_key_compare<Comp>.
                                                        _M_key_compare.ctx_ptr + 0x10))->
                                            super__Vector_base<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start,
                                    (uint *)p_Var31,
                                    (uint *)(ulong)(uint)*(size_t *)
                                                          ((long)local_158._M_impl.
                                                                 super__Rb_tree_header._M_header.
                                                                 _M_right + 0x20));
                if (!bVar10) goto LAB_0039c299;
                bVar10 = false;
                p_Var26 = (_Rb_tree_header *)
                          local_158._M_impl.super__Rb_tree_header._M_header._M_right;
              }
              if (p_Var26 != (_Rb_tree_header *)0x0) {
                bVar11 = true;
                if (!bVar10 &&
                    &local_158._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var26) {
                  bVar11 = DuplicateKeyCheck<(anonymous_namespace)::KeyParser>::Comp::operator()
                                     ((Comp *)(((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                                                 *)((long)local_158._M_impl.
                                                          super__Rb_tree_key_compare<Comp>.
                                                          _M_key_compare.ctx_ptr + 0x10))->
                                              super__Vector_base<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start,
                                      (uint *)*(CScript **)
                                               ((long)local_158._M_impl.
                                                      super__Rb_tree_key_compare<Comp>.
                                                      _M_key_compare.ctx_ptr + 0x18),
                                      (uint *)(ulong)(p_Var14->_M_header)._M_color);
                }
                p_Var31 = (_Rb_tree_header *)operator_new(0x28);
                *(_Rb_tree_color *)&p_Var31->_M_node_count = (p_Var14->_M_header)._M_color;
                std::_Rb_tree_insert_and_rebalance
                          (bVar11,(_Rb_tree_node_base *)p_Var31,&p_Var26->_M_header,
                           (_Rb_tree_node_base *)&local_158._M_impl.super__Rb_tree_header);
                local_158._M_impl.super__Rb_tree_header._M_node_count =
                     (long)&((Satisfier<CPubKey> *)
                            local_158._M_impl.super__Rb_tree_header._M_node_count)->m_provider + 1;
              }
              p_Var14 = (_Rb_tree_header *)&(p_Var14->_M_header).field_0x4;
            } while (p_Var14 != (_Rb_tree_header *)puVar3);
          }
          pWVar35 = (WshSatisfier *)(lVar34 >> 2);
          if ((WshSatisfier *)local_158._M_impl.super__Rb_tree_header._M_node_count == pWVar35) {
            pWVar36 = pWVar35;
            if (lVar2 != lVar1) {
              do {
                pWVar4 = *(WshSatisfier **)(lVar37 + 0x28);
                pWVar15 = pWVar35;
                if (pWVar35 < pWVar4) {
                  p_Var5 = *(_Base_ptr *)(lVar37 + 0x10);
                  if (local_158._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
                  {
                    if (p_Var5 != (_Base_ptr)0x0) {
                      local_158._M_impl.super__Rb_tree_header._M_header._M_color =
                           *(_Rb_tree_color *)(lVar37 + 8);
                      local_158._M_impl.super__Rb_tree_header._M_header._M_left =
                           *(_Base_ptr *)(lVar37 + 0x18);
                      local_158._M_impl.super__Rb_tree_header._M_header._M_right =
                           *(_Base_ptr *)(lVar37 + 0x20);
                      ((_Rb_tree_impl<Comp,_false> *)&p_Var5->_M_parent)->
                      super__Rb_tree_key_compare<Comp> =
                           (_Rb_tree_key_compare<Comp>)&local_158._M_impl.super__Rb_tree_header;
                      *(undefined8 *)(lVar37 + 0x10) = 0;
                      *(long *)(lVar37 + 0x18) = lVar37 + 8U;
                      *(long *)(lVar37 + 0x20) = lVar37 + 8U;
                      *(undefined8 *)(lVar37 + 0x28) = 0;
                      pWVar15 = pWVar4;
                      pWVar36 = pWVar4;
                      local_158._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var5;
                      local_158._M_impl.super__Rb_tree_header._M_node_count = (size_t)pWVar4;
                    }
                  }
                  else if (p_Var5 == (_Base_ptr)0x0) {
                    *(_Rb_tree_color *)(lVar37 + 8) =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_color;
                    *(_Base_ptr *)(lVar37 + 0x10) =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_parent;
                    *(_Base_ptr *)(lVar37 + 0x18) =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_left;
                    *(_Base_ptr *)(lVar37 + 0x20) =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_right;
                    ((_Rb_tree_impl<Comp,_false> *)
                    &(local_158._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->
                    super__Rb_tree_key_compare<Comp> = (_Rb_tree_key_compare<Comp>)(lVar37 + 8);
                    *(WshSatisfier **)(lVar37 + 0x28) = pWVar35;
                    local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                    local_158._M_impl.super__Rb_tree_header._M_header._M_left =
                         &local_158._M_impl.super__Rb_tree_header._M_header;
                    local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
                    pWVar15 = (WshSatisfier *)0x0;
                    pWVar36 = (WshSatisfier *)0x0;
                    local_158._M_impl.super__Rb_tree_header._M_header._M_right =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_left;
                  }
                  else {
                    *(_Base_ptr *)(lVar37 + 0x10) =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_parent;
                    p_Var31 = *(_Rb_tree_header **)(lVar37 + 0x18);
                    *(_Base_ptr *)(lVar37 + 0x18) =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_left;
                    p_Var14 = *(_Rb_tree_header **)(lVar37 + 0x20);
                    *(_Base_ptr *)(lVar37 + 0x20) =
                         local_158._M_impl.super__Rb_tree_header._M_header._M_right;
                    ((_Rb_tree_impl<Comp,_false> *)&p_Var5->_M_parent)->
                    super__Rb_tree_key_compare<Comp> =
                         (_Rb_tree_key_compare<Comp>)&local_158._M_impl.super__Rb_tree_header;
                    *(long *)(*(long *)(lVar37 + 0x10) + 8) = lVar37 + 8;
                    *(WshSatisfier **)(lVar37 + 0x28) = pWVar35;
                    pWVar15 = pWVar4;
                    pWVar36 = pWVar4;
                    local_158._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var5;
                    local_158._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)p_Var31;
                    local_158._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)p_Var14;
                    local_158._M_impl.super__Rb_tree_header._M_node_count = (size_t)pWVar4;
                  }
                  CVar6.ctx_ptr = *(WshSatisfier **)lVar37;
                  *(Comp *)lVar37 =
                       local_158._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr;
                  local_158._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr =
                       (Comp)(Comp)CVar6.ctx_ptr;
                }
                p_Var16 = *(_Rb_tree_node_base **)(lVar37 + 0x18);
                while (p_Var17 = p_Var16, p_Var17 != (_Rb_tree_node_base *)(lVar37 + 8U)) {
                  p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
                  pVar39 = std::
                           _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                           ::_M_get_insert_unique_pos(&local_158,&p_Var17[1]._M_color);
                  p_Var27 = pVar39.second;
                  pWVar15 = (WshSatisfier *)local_158._M_impl.super__Rb_tree_header._M_node_count;
                  pWVar36 = (WshSatisfier *)local_158._M_impl.super__Rb_tree_header._M_node_count;
                  if (p_Var27 != (_Rb_tree_node_base *)0x0) {
                    p_Var17 = (_Rb_tree_node_base *)
                              std::_Rb_tree_rebalance_for_erase
                                        (p_Var17,(_Rb_tree_node_base *)(lVar37 + 8U));
                    *(long *)(lVar37 + 0x28U) = *(long *)(lVar37 + 0x28U) + 0xffffffffffffffff;
                    bVar10 = true;
                    if (&local_158._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var27 &&
                        pVar39.first == (_Rb_tree_node_base *)0x0) {
                      bVar10 = DuplicateKeyCheck<(anonymous_namespace)::KeyParser>::Comp::operator()
                                         ((Comp *)(((
                                                  vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                                                  *)((long)local_158._M_impl.
                                                           super__Rb_tree_key_compare<Comp>.
                                                           _M_key_compare.ctx_ptr + 0x10))->
                                                  super__Vector_base<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start,
                                          (uint *)*(CScript **)
                                                   ((long)local_158._M_impl.
                                                          super__Rb_tree_key_compare<Comp>.
                                                          _M_key_compare.ctx_ptr + 0x18),
                                          (uint *)(ulong)p_Var17[1]._M_color);
                    }
                    std::_Rb_tree_insert_and_rebalance
                              (bVar10,p_Var17,(_Rb_tree_node_base *)p_Var27,
                               (_Rb_tree_node_base *)&local_158._M_impl.super__Rb_tree_header);
                    pWVar15 = (WshSatisfier *)
                              ((long)&((Satisfier<CPubKey> *)
                                      local_158._M_impl.super__Rb_tree_header._M_node_count)->
                                      m_provider + 1);
                    pWVar36 = pWVar15;
                    local_158._M_impl.super__Rb_tree_header._M_node_count = (size_t)pWVar15;
                  }
                }
                pWVar35 = (WshSatisfier *)
                          ((long)&(pWVar35->super_Satisfier<CPubKey>).m_provider +
                          (long)&(pWVar4->super_Satisfier<CPubKey>).m_provider);
                p_Var31 = p_Var24;
                if (pWVar15 != pWVar35) goto LAB_0039c5ec;
                lVar37 = lVar37 + 0x38;
              } while ((_Rb_tree_header *)lVar37 != p_Var24);
            }
            local_68._M_header._M_parent =
                 (_Base_ptr)local_158._M_impl.super__Rb_tree_header._M_header._M_parent;
            *(undefined2 *)(lVar18 + 0xa0) = 0x100;
            local_70.ctx_ptr =
                 (WshSatisfier *)
                 local_158._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr;
            if (local_158._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
              auVar22[0] = '\0';
              auVar22[1] = '\0';
              auVar22[2] = '\0';
              auVar22[3] = '\0';
              local_68._M_header._M_left = &local_68._M_header;
              p_Var24 = &local_68;
              p_Var31 = (_Rb_tree_header *)local_68._M_header._M_left;
            }
            else {
              *(_Rb_tree_header **)
               &((_Rb_tree_header *)
                &(local_158._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent)->
                _M_header = &local_68;
              local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              p_Var33 = &local_158._M_impl.super__Rb_tree_header;
              p_Var24 = (_Rb_tree_header *)&local_158._M_impl.super__Rb_tree_header;
              local_68._M_header._M_left =
                   (_Base_ptr)local_158._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var31 = (_Rb_tree_header *)
                        local_158._M_impl.super__Rb_tree_header._M_header._M_right;
              auVar22 = (uchar  [4])local_158._M_impl.super__Rb_tree_header._M_header._M_color;
              local_158._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var33->_M_header;
              local_158._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var33->_M_header;
              local_68._M_node_count = (size_t)pWVar36;
            }
            local_68._M_header._M_right = &p_Var31->_M_header;
            p_Var24->_M_node_count = 0;
            local_40 = 1;
            local_68._M_header._M_color = (_Rb_tree_color)auVar22;
          }
          else {
LAB_0039c5ec:
            *(undefined2 *)(lVar18 + 0xa0) = 0x101;
            local_40 = 0;
          }
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
          ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                      *)local_158._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (_Link_type)p_Var31);
          p_Var9 = local_68._M_header._M_parent;
          local_80 = '\0';
          if ((local_40 & 1) != 0) {
            local_c8._24_8_ = local_70.ctx_ptr;
            if ((_Base_ptr)local_68._M_header._M_parent == (_Base_ptr)0x0) {
              local_c8[0x20] = '\0';
              local_c8[0x21] = '\0';
              local_c8[0x22] = '\0';
              local_c8[0x23] = '\0';
              local_98 = (_Rb_tree_header *)(local_c8 + 0x20);
              p_Var24 = (_Rb_tree_header *)(local_c8 + 0x20);
              p_Var31 = local_98;
            }
            else {
              *(undefined1 **)
               &((_Rb_tree_header *)&(local_68._M_header._M_parent)->_M_parent)->_M_header =
                   local_c8 + 0x20;
              local_88 = (WshSatisfier *)local_68._M_node_count;
              local_68._M_header._M_parent = (_Base_ptr)0x0;
              p_Var24 = &local_68;
              local_98 = (_Rb_tree_header *)local_68._M_header._M_left;
              p_Var31 = (_Rb_tree_header *)local_68._M_header._M_right;
              local_c8._32_4_ = local_68._M_header._M_color;
              local_68._M_header._M_left = &local_68._M_header;
              local_68._M_header._M_right = &local_68._M_header;
            }
            local_a0 = (_Base_ptr)p_Var9;
            p_Var24->_M_node_count = 0;
            local_80 = '\x01';
            p_Stack_90 = p_Var31;
          }
        }
        poVar21 = local_198.
                  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_78 = 1;
        lVar18 = *(long *)(lVar18 + 0x40) - *(long *)(lVar18 + 0x38) >> 4;
        poVar32 = local_198.
                  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (lVar18 * -0x38 != 0) {
          poVar32 = local_198.
                    super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -lVar18;
          poVar20 = poVar32;
          do {
            if ((poVar20->
                super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                ._M_engaged == true) {
              (poVar20->
              super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
              ._M_engaged = false;
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
              ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                          *)*(_Base_ptr *)
                             ((long)&(poVar20->
                                     super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                     )._M_payload.
                                     super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                     ._M_payload._M_value._M_t + 0x10),(_Link_type)p_Var31);
            }
            poVar20 = poVar20 + 1;
          } while (poVar20 != poVar21);
        }
        local_198.
        super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = poVar32;
        poVar32 = local_198.
                  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        poVar21 = local_198.
                  super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_198.
            super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_198.
            super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          if ((long)local_198.
                    super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_198.
                    super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0039cd25;
            std::__throw_length_error("vector::_M_realloc_insert");
            goto LAB_0039cc6c;
          }
          lVar18 = (long)local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          uVar38 = lVar18 * 0x6db6db6db6db6db7;
          uVar19 = uVar38;
          if (local_198.
              super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_198.
              super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar19 = 1;
          }
          uVar29 = uVar19 + uVar38;
          if (0x249249249249248 < uVar29) {
            uVar29 = 0x249249249249249;
          }
          if (CARRY8(uVar19,uVar38)) {
            uVar29 = 0x249249249249249;
          }
          if (uVar29 == 0) {
            poVar20 = (pointer)0x0;
          }
          else {
            poVar20 = (pointer)operator_new(uVar29 * 0x38);
          }
          lVar18 = lVar18 * 8;
          *(undefined1 *)
           ((long)&(poVar20->
                   super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                   ._M_engaged + lVar18) = 0;
          poVar7 = poVar20;
          poVar8 = poVar21;
          if (local_80 == '\x01') {
            puVar28 = (undefined8 *)
                      ((long)&(poVar20->
                              super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                              ._M_payload + lVar18);
            *puVar28 = local_c8._24_8_;
            p_Var24 = (_Rb_tree_header *)(puVar28 + 1);
            if (local_a0 == (_Base_ptr)0x0) {
              puVar28[2] = 0;
              ppWVar23 = (WshSatisfier **)(puVar28 + 5);
              auVar25[0] = '\0';
              auVar25[1] = '\0';
              auVar25[2] = '\0';
              auVar25[3] = '\0';
              p_Var31 = p_Var24;
            }
            else {
              puVar28[2] = local_a0;
              *(_Rb_tree_header **)&((_Rb_tree_header *)&local_a0->_M_parent)->_M_header = p_Var24;
              puVar28[5] = local_88;
              local_a0 = (_Base_ptr)0x0;
              ppWVar23 = &local_88;
              p_Var24 = local_98;
              p_Var31 = p_Stack_90;
              auVar25 = (uchar  [4])local_c8._32_4_;
              local_98 = (_Rb_tree_header *)(local_c8 + 0x20);
              p_Stack_90 = (_Rb_tree_header *)(local_c8 + 0x20);
            }
            puVar28[3] = p_Var24;
            puVar28[4] = p_Var31;
            *ppWVar23 = (WshSatisfier *)0x0;
            *(uchar (*) [4])(puVar28 + 1) = auVar25;
            *(undefined1 *)(puVar28 + 6) = 1;
          }
          for (; poVar32 != poVar8; poVar8 = poVar8 + 1) {
            (poVar7->
            super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
            ._M_engaged = false;
            bVar12 = (poVar8->
                     super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                     ._M_engaged;
            if ((bool)bVar12 == true) {
              *(undefined8 *)
               &(poVar7->
                super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                ._M_payload._M_value._M_t =
                   *(undefined8 *)
                    &(poVar8->
                     super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                     ._M_payload._M_value._M_t;
              p_Var31 = (_Rb_tree_header *)
                        ((long)&(poVar8->
                                super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                ._M_payload._M_value._M_t + 8);
              ::wallet::_GLOBAL__N_1::std::_Rb_tree_header::_Rb_tree_header
                        ((_Rb_tree_header *)
                         ((long)&(poVar7->
                                 super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                 )._M_payload.
                                 super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                 ._M_payload._M_value._M_t + 8),p_Var31);
              (poVar7->
              super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
              ._M_engaged = true;
              bVar12 = (poVar8->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_engaged;
            }
            if ((bVar12 & 1) != 0) {
              (poVar8->
              super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
              ._M_engaged = false;
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
              ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                          *)*(_Base_ptr *)
                             ((long)&(poVar8->
                                     super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                     )._M_payload.
                                     super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                     ._M_payload._M_value._M_t + 0x10),(_Link_type)p_Var31);
            }
            poVar7 = poVar7 + 1;
          }
          if (poVar21 != (pointer)0x0) {
            p_Var31 = (_Rb_tree_header *)
                      ((long)local_198.
                             super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)poVar21);
            operator_delete(poVar21,(ulong)p_Var31);
          }
          local_198.
          super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = poVar20 + uVar29;
          local_198.
          super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = poVar20;
          local_198.
          super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = poVar7;
        }
        else {
          ((local_198.
            super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->
          super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
          ._M_engaged = false;
          if (local_80 == '\x01') {
            *(undefined8 *)
             &((local_198.
                super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
              super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
              ._M_payload._M_value._M_t = local_c8._24_8_;
            puVar3 = (undefined1 *)
                     ((long)&((local_198.
                               super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->
                             super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                             ._M_payload + 8);
            if (local_a0 == (_Base_ptr)0x0) {
              *(_Base_ptr *)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_payload._M_value._M_t + 0x10) = (_Base_ptr)0x0;
              *(undefined1 **)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_payload._M_value._M_t + 0x18) = puVar3;
              *(undefined1 **)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_payload + 0x20) = puVar3;
              ppWVar23 = (WshSatisfier **)
                         ((long)&((local_198.
                                   super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish)->
                                 super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                                 )._M_payload.
                                 super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                                 ._M_payload + 0x28);
              auVar13[0] = '\0';
              auVar13[1] = '\0';
              auVar13[2] = '\0';
              auVar13[3] = '\0';
            }
            else {
              *(_Base_ptr *)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_payload + 0x10) = local_a0;
              *(_Rb_tree_header **)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_payload._M_value._M_t + 0x18) = local_98;
              *(_Rb_tree_header **)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_payload + 0x20) = p_Stack_90;
              *(undefined1 **)&((_Rb_tree_header *)&local_a0->_M_parent)->_M_header = puVar3;
              *(WshSatisfier **)
               ((long)&((local_198.
                         super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                       super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                       ._M_payload + 0x28) = local_88;
              local_a0 = (_Base_ptr)0x0;
              local_98 = (_Rb_tree_header *)(local_c8 + 0x20);
              ppWVar23 = &local_88;
              auVar13 = (uchar  [4])local_c8._32_4_;
              p_Stack_90 = local_98;
            }
            *ppWVar23 = (WshSatisfier *)0x0;
            *(uchar (*) [4])
             ((long)&((local_198.
                       super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->
                     super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                     ._M_payload + 8) = auVar13;
            ((local_198.
              super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
            super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
            ._M_engaged = true;
          }
        }
        p_Var24 = (_Rb_tree_header *)
                  (local_198.
                   super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1);
        pvVar30 = (void *)((long)pvStack_170 + -0x18);
        local_198.
        super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var24;
        pvStack_170 = pvVar30;
        if (((local_78 & 1) != 0) && (local_78 = 0, local_80 == '\x01')) {
          local_80 = '\0';
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
          ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                      *)local_a0,(_Link_type)p_Var31);
        }
      }
      poVar21 = local_198.
                super__Vector_base<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (pvVar30 != local_178);
  }
  pvVar30 = local_178;
  if ((long)p_Var24 - (long)poVar21 == 0x38) {
    local_c8[8] = '\0';
    if ((poVar21->
        super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
        .super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>.
        _M_engaged == true) {
      local_100._16_8_ =
           *(undefined8 *)
            &(poVar21->
             super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
             ._M_payload._M_value._M_t;
      local_d8 = (_Base_ptr)(local_100 + 0x18);
      local_e0 = *(_Base_ptr *)
                  ((long)&(poVar21->
                          super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                          ._M_payload._M_value._M_t + 0x10);
      if (local_e0 == (_Base_ptr)0x0) {
        puVar28 = (undefined8 *)local_c8;
        local_e0 = (_Base_ptr)0x0;
        local_100._24_4_ = _S_red;
        p_Stack_d0 = local_d8;
      }
      else {
        puVar3 = (undefined1 *)
                 ((long)&(poVar21->
                         super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                         ._M_payload + 8);
        local_100._24_4_ =
             *(undefined4 *)
              ((long)&(poVar21->
                      super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                      ._M_payload + 8);
        p_Var5 = *(_Base_ptr *)
                  ((long)&(poVar21->
                          super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                          ._M_payload._M_value._M_t + 0x18);
        p_Stack_d0 = *(_Base_ptr *)
                      ((long)&(poVar21->
                              super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                              ._M_payload + 0x20);
        *(_Base_ptr *)&((_Rb_tree_header *)&local_e0->_M_parent)->_M_header = local_d8;
        puVar28 = (undefined8 *)
                  ((long)&(poVar21->
                          super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                          ._M_payload + 0x28);
        local_c8._0_8_ =
             *(undefined8 *)
              ((long)&(poVar21->
                      super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                      ._M_payload + 0x28);
        *(_Base_ptr *)
         ((long)&(poVar21->
                 super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                 ._M_payload._M_value._M_t + 0x10) = (_Base_ptr)0x0;
        *(undefined1 **)
         ((long)&(poVar21->
                 super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                 ._M_payload._M_value._M_t + 0x18) = puVar3;
        *(undefined1 **)
         ((long)&(poVar21->
                 super__Optional_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>
                 ._M_payload + 0x20) = puVar3;
        local_d8 = p_Var5;
      }
      *puVar28 = 0;
      local_c8[8] = '\x01';
    }
    local_c8[0x10] = 1;
    std::
    vector<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>,_std::allocator<std::optional<std::set<unsigned_int,_Comp,_std::allocator<unsigned_int>_>_>_>_>
    ::~vector(&local_198);
    if (pvVar30 != (void *)0x0) {
      operator_delete(pvVar30,local_168 - (long)pvVar30);
    }
    p_Var5 = local_e0;
    if (local_c8[8] == '\x01') {
      local_120._M_left = &local_120;
      local_128 = (_Base_ptr)local_100._16_8_;
      if (local_e0 == (_Base_ptr)0x0) {
        local_120._M_color = _S_red;
        __x = (_Link_type)local_100;
        local_120._M_right = local_120._M_left;
      }
      else {
        __x = (_Link_type)local_c8;
        *(_Base_ptr *)&((_Rb_tree_header *)&local_e0->_M_parent)->_M_header = local_120._M_left;
        local_100._0_8_ = local_c8._0_8_;
        local_120._M_left = local_d8;
        local_120._M_right = p_Stack_d0;
        local_120._M_color = local_100._24_4_;
      }
      local_120._M_parent = local_e0;
      *(undefined8 *)&__x->super__Rb_tree_node_base = 0;
      local_100[8] = 0;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
      ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_Comp,_std::allocator<unsigned_int>_>
                  *)p_Var5,__x);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
LAB_0039cd25:
    __stack_chk_fail();
  }
LAB_0039cc6c:
  __assert_fail("results.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                ,0x27e,
                "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = std::optional<std::set<unsigned int, Comp>>, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
               );
}

Assistant:

void DuplicateKeyCheck(const Ctx& ctx) const
    {
        // We cannot use a lambda here, as lambdas are non assignable, and the set operations
        // below require moving the comparators around.
        struct Comp {
            const Ctx* ctx_ptr;
            Comp(const Ctx& ctx) : ctx_ptr(&ctx) {}
            bool operator()(const Key& a, const Key& b) const { return ctx_ptr->KeyCompare(a, b); }
        };

        // state in the recursive computation:
        // - std::nullopt means "this node has duplicates"
        // - an std::set means "this node has no duplicate keys, and they are: ...".
        using keyset = std::set<Key, Comp>;
        using state = std::optional<keyset>;

        auto upfn = [&ctx](const Node& node, Span<state> subs) -> state {
            // If this node is already known to have duplicates, nothing left to do.
            if (node.has_duplicate_keys.has_value() && *node.has_duplicate_keys) return {};

            // Check if one of the children is already known to have duplicates.
            for (auto& sub : subs) {
                if (!sub.has_value()) {
                    node.has_duplicate_keys = true;
                    return {};
                }
            }

            // Start building the set of keys involved in this node and children.
            // Start by keys in this node directly.
            size_t keys_count = node.keys.size();
            keyset key_set{node.keys.begin(), node.keys.end(), Comp(ctx)};
            if (key_set.size() != keys_count) {
                // It already has duplicates; bail out.
                node.has_duplicate_keys = true;
                return {};
            }

            // Merge the keys from the children into this set.
            for (auto& sub : subs) {
                keys_count += sub->size();
                // Small optimization: std::set::merge is linear in the size of the second arg but
                // logarithmic in the size of the first.
                if (key_set.size() < sub->size()) std::swap(key_set, *sub);
                key_set.merge(*sub);
                if (key_set.size() != keys_count) {
                    node.has_duplicate_keys = true;
                    return {};
                }
            }

            node.has_duplicate_keys = false;
            return key_set;
        };

        TreeEval<state>(upfn);
    }